

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_>::SymbolicAddKel
          (TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_> *this,
          TPZVec<long> *destinationindex)

{
  TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_> *in_RSI;
  TPZVec<long> *in_RDI;
  TPZFrontNonSym<float> *unaff_retaddr;
  int64_t maxeq;
  int64_t mineq;
  long in_stack_ffffffffffffffe0;
  long in_stack_ffffffffffffffe8;
  
  TPZFrontNonSym<float>::SymbolicAddKel(unaff_retaddr,in_RDI);
  EquationsToDecompose
            ((TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_> *)mineq,
             (TPZVec<long> *)maxeq,(int64_t *)unaff_retaddr,(int64_t *)in_RDI);
  if (in_stack_ffffffffffffffe8 <= in_stack_ffffffffffffffe0) {
    TPZFrontNonSym<float>::SymbolicDecomposeEquations
              ((TPZFrontNonSym<float> *)in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    CheckCompress(in_RSI);
  }
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::SymbolicAddKel(TPZVec < int64_t > & destinationindex)
{
	fFront.SymbolicAddKel(destinationindex);
	int64_t mineq, maxeq;
	EquationsToDecompose(destinationindex, mineq, maxeq);
	
	if(maxeq >= mineq) {
		fFront.SymbolicDecomposeEquations(mineq,maxeq);
		CheckCompress();
	}
	
}